

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransportamqp_methods.c
# Opt level: O1

void remove_tracked_handle
               (IOTHUBTRANSPORT_AMQP_METHODS *amqp_methods_handle,
               IOTHUBTRANSPORT_AMQP_METHOD_HANDLE method_request_handle)

{
  ulong uVar1;
  IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *ppIVar2;
  LOGGER_LOG p_Var3;
  ulong uVar4;
  
  uVar1 = amqp_methods_handle->method_request_handle_count;
  if (uVar1 != 0) {
    uVar4 = 0;
    do {
      if (amqp_methods_handle->method_request_handles[uVar4] == method_request_handle) {
        if (1 < uVar1 - uVar4) {
          ppIVar2 = amqp_methods_handle->method_request_handles + uVar4;
          memmove(ppIVar2,ppIVar2 + 1,(uVar1 - uVar4) * 8 - 8);
        }
        amqp_methods_handle->method_request_handle_count =
             amqp_methods_handle->method_request_handle_count - 1;
        uVar4 = uVar4 - 1;
      }
      uVar4 = uVar4 + 1;
      uVar1 = amqp_methods_handle->method_request_handle_count;
    } while (uVar4 < uVar1);
  }
  if (uVar1 == 0) {
    free(amqp_methods_handle->method_request_handles);
    amqp_methods_handle->method_request_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)0x0;
  }
  else {
    uVar4 = -(ulong)(uVar1 >> 0x3d != 0) | uVar1 << 3;
    if ((uVar1 >> 0x3d == 0) &&
       (ppIVar2 = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)
                  realloc(amqp_methods_handle->method_request_handles,uVar4),
       ppIVar2 != (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE *)0x0)) {
      amqp_methods_handle->method_request_handles = ppIVar2;
      return;
    }
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransportamqp_methods.c"
                ,"remove_tracked_handle",0x61,1,"realloc error, size:%zu",uVar4);
    }
  }
  return;
}

Assistant:

static void remove_tracked_handle(IOTHUBTRANSPORT_AMQP_METHODS* amqp_methods_handle, IOTHUBTRANSPORT_AMQP_METHOD_HANDLE method_request_handle)
{
    size_t i;

    for (i = 0; i < amqp_methods_handle->method_request_handle_count; i++)
    {
        if (amqp_methods_handle->method_request_handles[i] == method_request_handle)
        {
            if (amqp_methods_handle->method_request_handle_count - i > 1)
            {
                (void)memmove(&amqp_methods_handle->method_request_handles[i], &amqp_methods_handle->method_request_handles[i + 1],
                    (amqp_methods_handle->method_request_handle_count - i - 1) * sizeof(IOTHUBTRANSPORT_AMQP_METHOD_HANDLE));
            }

            amqp_methods_handle->method_request_handle_count--;
            i--;
        }
    }

    if (amqp_methods_handle->method_request_handle_count == 0)
    {
        free(amqp_methods_handle->method_request_handles);
        amqp_methods_handle->method_request_handles = NULL;
    }
    else
    {
        IOTHUBTRANSPORT_AMQP_METHOD_HANDLE* new_handles;
        size_t realloc_size = safe_multiply_size_t(amqp_methods_handle->method_request_handle_count, sizeof(IOTHUBTRANSPORT_AMQP_METHOD_HANDLE));
        if (realloc_size != SIZE_MAX && (
            new_handles = (IOTHUBTRANSPORT_AMQP_METHOD_HANDLE*)realloc(amqp_methods_handle->method_request_handles, realloc_size)) != NULL)
        {
            amqp_methods_handle->method_request_handles = new_handles;
        }
        else
        {
            LogError("realloc error, size:%zu", realloc_size);
        }
    }
}